

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

size_t clip_image_f32_batch_nx(clip_image_f32_batch *batch,int idx)

{
  pointer puVar1;
  size_t sVar2;
  
  if ((idx < 0) ||
     (puVar1 = (batch->entries).
               super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (int)((ulong)((long)(batch->entries).
                         super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 3) <= idx)) {
    if ((int)g_logger_state.verbosity_thold < 5) {
      sVar2 = 0;
      clip_log_internal(GGML_LOG_LEVEL_ERROR,"%s: invalid index %d\n","clip_image_f32_batch_nx");
    }
    else {
      sVar2 = 0;
    }
  }
  else {
    sVar2 = (size_t)*(int *)puVar1[(uint)idx]._M_t.
                            super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>;
  }
  return sVar2;
}

Assistant:

size_t clip_image_f32_batch_nx(const struct clip_image_f32_batch * batch, int idx) {
    if (idx < 0 || idx >= (int)batch->entries.size()) {
        LOG_ERR("%s: invalid index %d\n", __func__, idx);
        return 0;
    }
    return batch->entries[idx]->nx;
}